

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O2

GLboolean glxewGetExtension(char *name)

{
  GLboolean GVar1;
  GLuint GVar2;
  Display *pDVar3;
  GLubyte *s;
  
  if (__glewXGetCurrentDisplay != (PFNGLXGETCURRENTDISPLAYPROC)0x0) {
    pDVar3 = (*__glewXGetCurrentDisplay)();
    s = (GLubyte *)glXGetClientString(pDVar3,3);
    if (s != (GLubyte *)0x0) {
      GVar2 = _glewStrLen(s);
      GVar1 = _glewSearchExtension(name,s,s + GVar2);
      return GVar1;
    }
  }
  return '\0';
}

Assistant:

GLboolean glxewGetExtension (const char* name)
{    
  const GLubyte* start;
  const GLubyte* end;

  if (glXGetCurrentDisplay == NULL) return GL_FALSE;
  start = (const GLubyte*)glXGetClientString(glXGetCurrentDisplay(), GLX_EXTENSIONS);
  if (0 == start) return GL_FALSE;
  end = start + _glewStrLen(start);
  return _glewSearchExtension(name, start, end);
}